

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Sched.c
# Opt level: O3

int Llb_MtrFindBestColumn(Llb_Mtr_t *p,int iGrpStart)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  
  uVar2 = p->nRows;
  uVar3 = uVar2 - p->nFfs;
  if (uVar3 == 0 || (int)uVar2 < p->nFfs) {
    iVar6 = -1;
  }
  else {
    iVar8 = -1000000000;
    iVar6 = -1;
    uVar12 = 0;
    iVar4 = -1;
    do {
      if (((1 < p->pRowSums[uVar12]) && (p->pProdVars[uVar12] == '\x01')) &&
         (p->pProdNums[uVar12] == 1)) {
        if (p->nCols + -1 <= iGrpStart) {
LAB_007d6271:
          __assert_fail("Counter == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Sched.c"
                        ,0x65,"int Llb_MtrFindBestColumn(Llb_Mtr_t *, int)");
        }
        lVar11 = 0;
        iVar5 = 0;
        do {
          bVar13 = p->pMatrix[iGrpStart + lVar11][uVar12] == '\x01';
          if (bVar13) {
            iVar4 = iGrpStart + (int)lVar11;
          }
          iVar5 = iVar5 + (uint)bVar13;
          lVar11 = lVar11 + 1;
        } while ((long)p->nCols + ~(long)iGrpStart != lVar11);
        if (iVar5 != 1) goto LAB_007d6271;
        if ((int)uVar2 < 1) {
          iVar5 = 0;
        }
        else {
          uVar9 = 0;
          iVar5 = 0;
          do {
            cVar1 = p->pProdVars[uVar9];
            if (cVar1 == '\0') {
              iVar10 = iVar5 - (uint)(p->pMatrix[iVar4][uVar9] == '\x01');
            }
            else {
              iVar10 = iVar5;
              if (((cVar1 == '\x01') && (p->pMatrix[iVar4][uVar9] == '\x01')) &&
                 (iVar10 = iVar5 + 2, p->pProdNums[uVar9] != 1)) {
                iVar10 = iVar5;
              }
            }
            iVar5 = iVar10;
            uVar9 = uVar9 + 1;
          } while (uVar2 != uVar9);
        }
        if (0 < iVar5 && iVar8 < iVar5) {
          iVar8 = iVar5;
          iVar6 = iVar4;
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar3);
    if (-1 < iVar6) {
      return iVar6;
    }
  }
  lVar11 = (long)p->nCols + -1;
  if (iGrpStart < (int)lVar11) {
    lVar7 = (long)iGrpStart;
    iVar4 = 1000000000;
    iVar8 = 1000000000;
    do {
      if ((int)uVar2 < 1) {
        iVar10 = 0;
        iVar5 = 0;
      }
      else {
        uVar12 = 0;
        iVar5 = 0;
        iVar10 = 0;
        do {
          if ((p->pProdVars[uVar12] == '\0') && (p->pMatrix[lVar7][uVar12] == '\x01')) {
            iVar10 = iVar10 + 1;
            iVar5 = iVar5 + p->pProdNums[uVar12];
          }
          uVar12 = uVar12 + 1;
        } while (uVar2 != uVar12);
      }
      if ((iVar10 < iVar8) || ((iVar8 == iVar10 && (iVar4 < iVar5)))) {
        iVar6 = (int)lVar7;
        iVar8 = iVar10;
        iVar4 = iVar5;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != lVar11);
  }
  return iVar6;
}

Assistant:

int Llb_MtrFindBestColumn( Llb_Mtr_t * p, int iGrpStart )
{
    int Cost, Cost2, CostBest = ABC_INFINITY, Cost2Best = ABC_INFINITY;
    int WeightCur, WeightBest = -ABC_INFINITY, iGrp = -1, iGrpBest = -1;
    int k, c, iVar, Counter;
    // find partition that reduces partial product as much as possible
    for ( iVar = 0; iVar < p->nRows - p->nFfs; iVar++ )
    { 
        if ( p->pRowSums[iVar] < 2 )
            continue;
        // look at present variables that can be quantified
        if ( !(p->pProdVars[iVar] == 1 && p->pProdNums[iVar] == 1) )
            continue;
        // check that it appears in one partition only
        Counter = 0;
        for ( c = iGrpStart; c < p->nCols-1; c++ )
            if ( p->pMatrix[c][iVar] == 1 )
            {
                iGrp = c;
                Counter++;
            }
        assert( Counter == 1 );
        if ( Counter != 1 )
            Abc_Print( -1, "Llb_MtrFindBestColumn() Internal error!\n" );
        // find weight of this column
        WeightCur = 0;
        for ( k = 0; k < p->nRows; k++ )
        {
            // increase weight if variable k will be quantified from partial product
            if ( p->pProdVars[k] == 1 && p->pMatrix[iGrp][k] == 1 && p->pProdNums[k] == 1 ) 
                WeightCur += 2;
            // decrease weight if variable k will be added to partial product
            if ( p->pProdVars[k] == 0 && p->pMatrix[iGrp][k] == 1 )
                WeightCur--;
        }
        if ( WeightCur > 0 && WeightBest < WeightCur )
        {
            WeightBest = WeightCur;
            iGrpBest   = iGrp;
        }
    }
    if ( iGrpBest >= 0 )
        return iGrpBest;
    // could not find the group with any vars to quantify
    // select the group that contains as few extra variables as possible
    // if there is a tie, select variables that appear in less groups than others
    for ( iGrp = iGrpStart; iGrp < p->nCols-1; iGrp++ )
    {
        Cost = Cost2 = 0;
        for ( k = 0; k < p->nRows; k++ )
            if ( p->pProdVars[k] == 0 && p->pMatrix[iGrp][k] == 1 )
            {
                Cost++;
                Cost2 += p->pProdNums[k];
            }
        if ( CostBest >  Cost || 
            (CostBest == Cost && Cost2 > Cost2Best) )
        {
            CostBest  = Cost;
            Cost2Best = Cost2;
            iGrpBest  = iGrp;
        }
    }
    return iGrpBest;
}